

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::Label::Label
          (Label *this,LabelType label_type,string *name,TypeVector *param_types,
          TypeVector *result_types)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  this->label_type = label_type;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&this->param_types,param_types);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&this->result_types,result_types);
  return;
}

Assistant:

Label(LabelType label_type,
        const std::string& name,
        const TypeVector& param_types,
        const TypeVector& result_types)
      : name(name),
        label_type(label_type),
        param_types(param_types),
        result_types(result_types) {}